

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void DeleteMove(pyhanabi_move_t *move)

{
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x80,"void DeleteMove(pyhanabi_move_t *)");
  }
  if (*in_RDI != 0) {
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    *in_RDI = 0;
    return;
  }
  __assert_fail("move->move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x81,"void DeleteMove(pyhanabi_move_t *)");
}

Assistant:

void DeleteMove(pyhanabi_move_t* move) {
  REQUIRE(move != nullptr);
  REQUIRE(move->move != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiMove*>(move->move);
  move->move = nullptr;
}